

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

bool __thiscall reflection::Type::Verify(Type *this,Verifier *verifier)

{
  bool bVar1;
  undefined1 local_19;
  Verifier *verifier_local;
  Type *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyField<signed_char>(&this->super_Table,verifier,4,1);
    local_19 = false;
    if (bVar1) {
      bVar1 = flatbuffers::Table::VerifyField<signed_char>(&this->super_Table,verifier,6,1);
      local_19 = false;
      if (bVar1) {
        bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,8,4);
        local_19 = false;
        if (bVar1) {
          bVar1 = flatbuffers::Table::VerifyField<unsigned_short>(&this->super_Table,verifier,10,2);
          local_19 = false;
          if (bVar1) {
            bVar1 = flatbuffers::Table::VerifyField<unsigned_int>(&this->super_Table,verifier,0xc,4)
            ;
            local_19 = false;
            if (bVar1) {
              bVar1 = flatbuffers::Table::VerifyField<unsigned_int>
                                (&this->super_Table,verifier,0xe,4);
              local_19 = false;
              if (bVar1) {
                local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<int8_t>(verifier, VT_BASE_TYPE, 1) &&
           VerifyField<int8_t>(verifier, VT_ELEMENT, 1) &&
           VerifyField<int32_t>(verifier, VT_INDEX, 4) &&
           VerifyField<uint16_t>(verifier, VT_FIXED_LENGTH, 2) &&
           VerifyField<uint32_t>(verifier, VT_BASE_SIZE, 4) &&
           VerifyField<uint32_t>(verifier, VT_ELEMENT_SIZE, 4) &&
           verifier.EndTable();
  }